

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O2

void __thiscall Diligent::DeviceContextGLImpl::BeginSubpass(DeviceContextGLImpl *this)

{
  uint uVar1;
  RenderPassGLImpl *Args_1;
  FramebufferGLImpl *pFVar2;
  SubpassDesc *pSVar3;
  AttachmentReference *pAVar4;
  pointer pOVar5;
  uint uVar6;
  GLFBOCreateReleaseHelper CreateReleaseHelper;
  ulong uVar7;
  TextureViewGLImpl *pTVar8;
  TextureBaseGL *pTVar9;
  RenderPassAttachmentDesc *pRVar10;
  TextureFormatAttribs *pTVar11;
  char (*in_RCX) [20];
  Uint32 rt;
  ulong uVar12;
  pointer pSVar13;
  string msg;
  
  if ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pActiveRenderPass.m_pObject ==
      (RenderPassGLImpl *)0x0) {
    FormatString<char[26],char[20]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_pActiveRenderPass",
               in_RCX);
    in_RCX = (char (*) [20])0x1ce;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"BeginSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x1ce);
    std::__cxx11::string::~string((string *)&msg);
  }
  if ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pBoundFramebuffer.m_pObject ==
      (FramebufferGLImpl *)0x0) {
    FormatString<char[26],char[20]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_pBoundFramebuffer",
               in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"BeginSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x1cf);
    std::__cxx11::string::~string((string *)&msg);
  }
  Args_1 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pActiveRenderPass.
           m_pObject;
  uVar6 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_SubpassIndex;
  if ((Args_1->super_RenderPassBase<Diligent::EngineGLImplTraits>).
      super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
      .m_Desc.SubpassCount <= uVar6) {
    FormatString<char[26],char[37]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_SubpassIndex < RPDesc.SubpassCount",(char (*) [37])Args_1);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"BeginSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x1d1);
    std::__cxx11::string::~string((string *)&msg);
    uVar6 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_SubpassIndex;
  }
  pFVar2 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pBoundFramebuffer.
           m_pObject;
  pSVar13 = (pFVar2->m_SubpassFramebuffers).
            super__Vector_base<Diligent::FramebufferGLImpl::SubpassFramebuffers,_std::allocator<Diligent::FramebufferGLImpl::SubpassFramebuffers>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pSVar3 = (Args_1->super_RenderPassBase<Diligent::EngineGLImplTraits>).
           super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
           .m_Desc.pSubpasses;
  if (pSVar13[uVar6].RenderTarget.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.
      m_uiHandle == 0) {
    CreateReleaseHelper.m_ExternalFBOHandle =
         (*(((this->m_pSwapChain).m_pObject)->super_ISwapChain).super_IObject._vptr_IObject[0xc])();
    if ((this->m_DefaultFBO).super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>.
        m_uiHandle != CreateReleaseHelper.m_ExternalFBOHandle) {
      GLObjectWrappers::GLFrameBufferObj::GLFrameBufferObj
                ((GLFrameBufferObj *)&msg,true,CreateReleaseHelper);
      GLObjectWrappers::GLFrameBufferObj::operator=(&this->m_DefaultFBO,(GLFrameBufferObj *)&msg);
      GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>::~GLObjWrapper
                ((GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper> *)&msg);
    }
    GLContextState::BindFBO(&this->m_ContextState,&this->m_DefaultFBO);
    this->m_DrawFBO = (GLFrameBufferObj *)0x0;
  }
  else {
    pSVar13 = pSVar13 + uVar6;
    GLContextState::BindFBO(&this->m_ContextState,&pSVar13->RenderTarget);
    this->m_DrawFBO = &pSVar13->RenderTarget;
    this->m_DrawBuffersCommitted = false;
  }
  for (uVar12 = 0; uVar12 < pSVar3[uVar6].RenderTargetAttachmentCount; uVar12 = uVar12 + 1) {
    pAVar4 = pSVar3[uVar6].pRenderTargetAttachments;
    uVar7 = (ulong)pAVar4[uVar12].AttachmentIndex;
    if (uVar7 != 0xffffffff) {
      pTVar8 = ClassPtrCast<Diligent::TextureViewGLImpl,Diligent::ITextureView>
                         ((pFVar2->super_FramebufferBase<Diligent::EngineGLImplTraits>).
                          super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                          .m_Desc.ppAttachments[uVar7]);
      if (pTVar8 != (TextureViewGLImpl *)0x0) {
        pTVar9 = TextureViewBase<Diligent::EngineGLImplTraits>::GetTexture<Diligent::TextureBaseGL>
                           (&pTVar8->super_TextureViewBase<Diligent::EngineGLImplTraits>);
        TextureBaseGL::TextureMemoryBarrier(pTVar9,MEMORY_BARRIER_FRAMEBUFFER,&this->m_ContextState)
        ;
        uVar1 = pAVar4[uVar12].AttachmentIndex;
        if (((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_SubpassIndex ==
             (((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pActiveRenderPass.
              m_pObject)->super_RenderPassBase<Diligent::EngineGLImplTraits>).
             m_AttachmentFirstLastUse[uVar1].first) &&
           ((Args_1->super_RenderPassBase<Diligent::EngineGLImplTraits>).
            super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
            .m_Desc.pAttachments[uVar1].LoadOp == ATTACHMENT_LOAD_OP_CLEAR)) {
          ClearRenderTarget(this,(ITextureView *)pTVar8,
                            (this->m_AttachmentClearValues).
                            super__Vector_base<Diligent::OptimizedClearValue,_std::allocator<Diligent::OptimizedClearValue>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar1].Color,
                            RESOURCE_STATE_TRANSITION_MODE_NONE);
        }
      }
    }
  }
  if ((pSVar3[uVar6].pDepthStencilAttachment != (AttachmentReference *)0x0) &&
     (uVar12 = (ulong)(pSVar3[uVar6].pDepthStencilAttachment)->AttachmentIndex, uVar12 != 0xffffffff
     )) {
    pTVar8 = ClassPtrCast<Diligent::TextureViewGLImpl,Diligent::ITextureView>
                       ((pFVar2->super_FramebufferBase<Diligent::EngineGLImplTraits>).
                        super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                        .m_Desc.ppAttachments[uVar12]);
    if (pTVar8 != (TextureViewGLImpl *)0x0) {
      pTVar9 = TextureViewBase<Diligent::EngineGLImplTraits>::GetTexture<Diligent::TextureBaseGL>
                         (&pTVar8->super_TextureViewBase<Diligent::EngineGLImplTraits>);
      TextureBaseGL::TextureMemoryBarrier(pTVar9,MEMORY_BARRIER_FRAMEBUFFER,&this->m_ContextState);
      if (((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_SubpassIndex ==
           (((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pActiveRenderPass.
            m_pObject)->super_RenderPassBase<Diligent::EngineGLImplTraits>).m_AttachmentFirstLastUse
           [uVar12].first) &&
         (pRVar10 = (Args_1->super_RenderPassBase<Diligent::EngineGLImplTraits>).
                    super_DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
                    .m_Desc.pAttachments + uVar12, pRVar10->LoadOp == ATTACHMENT_LOAD_OP_CLEAR)) {
        pTVar11 = GetTextureFormatAttribs(pRVar10->Format);
        pOVar5 = (this->m_AttachmentClearValues).
                 super__Vector_base<Diligent::OptimizedClearValue,_std::allocator<Diligent::OptimizedClearValue>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ClearDepthStencil(this,(ITextureView *)pTVar8,
                          (uint)(pTVar11->ComponentType == COMPONENT_TYPE_DEPTH_STENCIL) * 2 +
                          CLEAR_DEPTH_FLAG,(float)pOVar5[uVar12].DepthStencil.Depth,
                          pOVar5[uVar12].DepthStencil.Stencil,RESOURCE_STATE_TRANSITION_MODE_NONE);
      }
    }
  }
  return;
}

Assistant:

void DeviceContextGLImpl::BeginSubpass()
{
    VERIFY_EXPR(m_pActiveRenderPass);
    VERIFY_EXPR(m_pBoundFramebuffer);
    const RenderPassDesc& RPDesc = m_pActiveRenderPass->GetDesc();
    VERIFY_EXPR(m_SubpassIndex < RPDesc.SubpassCount);
    const SubpassDesc&     SubpassDesc = RPDesc.pSubpasses[m_SubpassIndex];
    const FramebufferDesc& FBDesc      = m_pBoundFramebuffer->GetDesc();

    GLObjectWrappers::GLFrameBufferObj& RenderTargetFBO = m_pBoundFramebuffer->GetSubpassFramebuffer(m_SubpassIndex).RenderTarget;
    if (RenderTargetFBO != 0)
    {
        m_ContextState.BindFBO(RenderTargetFBO);
        m_DrawFBO              = &RenderTargetFBO;
        m_DrawBuffersCommitted = false;
    }
    else
    {
        GLuint DefaultFBOHandle = m_pSwapChain->GetDefaultFBO();
        if (m_DefaultFBO != DefaultFBOHandle)
        {
            m_DefaultFBO = GLObjectWrappers::GLFrameBufferObj{true, GLObjectWrappers::GLFBOCreateReleaseHelper{DefaultFBOHandle}};
        }
        m_ContextState.BindFBO(m_DefaultFBO);
        m_DrawFBO = nullptr;
    }


    for (Uint32 rt = 0; rt < SubpassDesc.RenderTargetAttachmentCount; ++rt)
    {
        const AttachmentReference& RTAttachmentRef = SubpassDesc.pRenderTargetAttachments[rt];
        if (RTAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED)
        {
            TextureViewGLImpl* const pRTV = ClassPtrCast<TextureViewGLImpl>(FBDesc.ppAttachments[RTAttachmentRef.AttachmentIndex]);
            if (pRTV == nullptr)
                continue;

            TextureBaseGL* const pColorTexGL = pRTV->GetTexture<TextureBaseGL>();
            pColorTexGL->TextureMemoryBarrier(
                MEMORY_BARRIER_FRAMEBUFFER, // Reads and writes via framebuffer object attachments after the
                                            // barrier will reflect data written by shaders prior to the barrier.
                                            // Additionally, framebuffer writes issued after the barrier will wait
                                            // on the completion of all shader writes issued prior to the barrier.
                m_ContextState);

            const RenderPassAttachmentDesc& AttachmentDesc = RPDesc.pAttachments[RTAttachmentRef.AttachmentIndex];
            auto                            FirstLastUse   = m_pActiveRenderPass->GetAttachmentFirstLastUse(RTAttachmentRef.AttachmentIndex);
            if (FirstLastUse.first == m_SubpassIndex && AttachmentDesc.LoadOp == ATTACHMENT_LOAD_OP_CLEAR)
            {
                ClearRenderTarget(pRTV, m_AttachmentClearValues[RTAttachmentRef.AttachmentIndex].Color, RESOURCE_STATE_TRANSITION_MODE_NONE);
            }
        }
    }

    if (SubpassDesc.pDepthStencilAttachment != nullptr)
    {
        const Uint32 DepthAttachmentIndex = SubpassDesc.pDepthStencilAttachment->AttachmentIndex;
        if (DepthAttachmentIndex != ATTACHMENT_UNUSED)
        {
            TextureViewGLImpl* const pDSV = ClassPtrCast<TextureViewGLImpl>(FBDesc.ppAttachments[DepthAttachmentIndex]);
            if (pDSV != nullptr)
            {
                TextureBaseGL* pDepthTexGL = pDSV->GetTexture<TextureBaseGL>();
                pDepthTexGL->TextureMemoryBarrier(MEMORY_BARRIER_FRAMEBUFFER, m_ContextState);

                const RenderPassAttachmentDesc& AttachmentDesc = RPDesc.pAttachments[DepthAttachmentIndex];
                auto                            FirstLastUse   = m_pActiveRenderPass->GetAttachmentFirstLastUse(DepthAttachmentIndex);
                if (FirstLastUse.first == m_SubpassIndex && AttachmentDesc.LoadOp == ATTACHMENT_LOAD_OP_CLEAR)
                {
                    const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(AttachmentDesc.Format);

                    CLEAR_DEPTH_STENCIL_FLAGS ClearFlags = CLEAR_DEPTH_FLAG;
                    if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)
                        ClearFlags |= CLEAR_STENCIL_FLAG;

                    const DepthStencilClearValue& ClearVal = m_AttachmentClearValues[DepthAttachmentIndex].DepthStencil;
                    ClearDepthStencil(pDSV, ClearFlags, ClearVal.Depth, ClearVal.Stencil, RESOURCE_STATE_TRANSITION_MODE_NONE);
                }
            }
        }
    }
}